

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuzzingParameterSet.cpp
# Opt level: O3

void FuzzingParameterSet::print_dynamic_parameters2
               (bool sync_at_each_ref,int wait_until_hammering_us,int num_aggs_for_sync)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *args;
  string local_70;
  string local_50;
  
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Printing code jitting-related fuzzing parameters:","");
  Logger::log_info(&local_50,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  paVar2 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"sync_each_ref: %s","");
  args = "false";
  if (sync_at_each_ref) {
    args = "true";
  }
  format_string<char_const*>(&local_50,&local_70,args);
  Logger::log_data(&local_50,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"wait_until_start_hammering_refs: %d","");
  format_string<int>(&local_50,&local_70,wait_until_hammering_us);
  Logger::log_data(&local_50,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"num_aggressors_for_sync: %d","");
  format_string<int>(&local_50,&local_70,num_aggs_for_sync);
  Logger::log_data(&local_50,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void FuzzingParameterSet::print_dynamic_parameters2(bool sync_at_each_ref,
                                                    int wait_until_hammering_us,
                                                    int num_aggs_for_sync) {
  Logger::log_info("Printing code jitting-related fuzzing parameters:");
  Logger::log_data(format_string("sync_each_ref: %s", (sync_at_each_ref ? "true" : "false")));
  Logger::log_data(format_string("wait_until_start_hammering_refs: %d", wait_until_hammering_us));
  Logger::log_data(format_string("num_aggressors_for_sync: %d", num_aggs_for_sync));
}